

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  WildcardPortConnectionSyntax *pWVar1;
  Token local_40;
  Token local_30;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  pWVar1 = BumpAllocator::
           emplace<slang::syntax::WildcardPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_30,&local_40);
  return (int)pWVar1;
}

Assistant:

static SyntaxNode* clone(const WildcardPortConnectionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<WildcardPortConnectionSyntax>(
        *deepClone(node.attributes, alloc),
        node.dot.deepClone(alloc),
        node.star.deepClone(alloc)
    );
}